

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxh3.h
# Opt level: O0

XXH64_hash_t XXH_INLINE_XXH3_64bits_withSeed(void *input,size_t len,XXH64_hash_t seed)

{
  XXH64_hash_t XVar1;
  XXH64_hash_t in_RDX;
  xxh_u8 *in_RSI;
  xxh_u8 *in_RDI;
  xxh_u8 *unaff_retaddr;
  XXH64_hash_t in_stack_00000098;
  size_t in_stack_000000a0;
  xxh_u8 *in_stack_000000a8;
  xxh_u8 *in_stack_fffffffffffffff8;
  
  if (in_RSI < (xxh_u8 *)0x11) {
    XVar1 = XXH3_len_0to16_64b(in_stack_fffffffffffffff8,(size_t)in_RDI,in_RSI,in_RDX);
  }
  else if (in_RSI < (xxh_u8 *)0x81) {
    XVar1 = XXH3_len_17to128_64b
                      (unaff_retaddr,(size_t)in_stack_fffffffffffffff8,in_RDI,(size_t)in_RSI,in_RDX)
    ;
  }
  else if (in_RSI < (xxh_u8 *)0xf1) {
    XVar1 = XXH3_len_129to240_64b
                      (unaff_retaddr,(size_t)in_stack_fffffffffffffff8,in_RDI,(size_t)in_RSI,in_RDX)
    ;
  }
  else {
    XVar1 = XXH3_hashLong_64b_withSeed(in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
  }
  return XVar1;
}

Assistant:

XXH_PUBLIC_API XXH64_hash_t
XXH3_64bits_withSeed(const void* input, size_t len, XXH64_hash_t seed)
{
    if (len <= 16) return XXH3_len_0to16_64b((const xxh_u8*)input, len, kSecret, seed);
    if (len <= 128) return XXH3_len_17to128_64b((const xxh_u8*)input, len, kSecret, sizeof(kSecret), seed);
    if (len <= XXH3_MIDSIZE_MAX) return XXH3_len_129to240_64b((const xxh_u8*)input, len, kSecret, sizeof(kSecret), seed);
    return XXH3_hashLong_64b_withSeed((const xxh_u8*)input, len, seed);
}